

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O1

void vision_recalc(int control)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  xchar xVar4;
  char **ppcVar5;
  boolean bVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  char **loc_cs_rows;
  ulong uVar10;
  char cVar11;
  char *left_most;
  uchar *puVar12;
  char cVar13;
  int iVar14;
  uint uVar15;
  char cVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  char *pcVar20;
  char cVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  char *right_most;
  long lVar28;
  char *pcVar29;
  bool bVar30;
  long local_48;
  long local_40;
  
  vision_full_recalc = '\0';
  if (in_mklev != '\0') {
    vision_full_recalc = '\0';
    return;
  }
  if (iflags.vision_inited == '\0') {
    vision_full_recalc = '\0';
    return;
  }
  bVar30 = viz_array != cs_rows0;
  loc_cs_rows = cs_rows1;
  if (bVar30) {
    loc_cs_rows = cs_rows0;
  }
  left_most = cs_rmin0;
  if (!bVar30) {
    left_most = cs_rmin1;
  }
  right_most = cs_rmax0;
  if (!bVar30) {
    right_most = cs_rmax1;
  }
  memset(*loc_cs_rows,0,0x690);
  builtin_strncpy(left_most,"OOOOOOOOOOOOOOOOOOOOO",0x15);
  right_most[0] = '\0';
  right_most[1] = '\0';
  right_most[2] = '\0';
  right_most[3] = '\0';
  right_most[4] = '\0';
  right_most[5] = '\0';
  right_most[6] = '\0';
  right_most[7] = '\0';
  right_most[8] = '\0';
  right_most[9] = '\0';
  right_most[10] = '\0';
  right_most[0xb] = '\0';
  right_most[0xc] = '\0';
  right_most[0xd] = '\0';
  right_most[0xe] = '\0';
  right_most[0xf] = '\0';
  right_most[0xd] = '\0';
  right_most[0xe] = '\0';
  right_most[0xf] = '\0';
  right_most[0x10] = '\0';
  right_most[0x11] = '\0';
  right_most[0x12] = '\0';
  right_most[0x13] = '\0';
  right_most[0x14] = '\0';
  if ((control != 2) && ((u._1052_1_ & 1) == 0)) {
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
      lVar26 = 0;
      view_from((int)u.uy,(int)u.ux,loc_cs_rows,left_most,right_most,0,
                (_func_void_int_int_void_ptr *)0x0,(void *)0x0);
      ppcVar5 = viz_array;
      viz_array = loc_cs_rows;
      do {
        cVar16 = viz_rmin[lVar26];
        cVar21 = left_most[lVar26];
        cVar13 = cVar21;
        if (cVar16 < cVar21) {
          cVar13 = cVar16;
        }
        cVar11 = right_most[lVar26];
        if (right_most[lVar26] < viz_rmax[lVar26]) {
          cVar11 = viz_rmax[lVar26];
        }
        if (cVar13 <= cVar11) {
          pcVar20 = ppcVar5[lVar26];
          if (cVar21 < cVar16) {
            cVar16 = cVar21;
          }
          lVar28 = (long)cVar16;
          do {
            if ((pcVar20[lVar28] & 2U) != 0) {
              newsym((int)lVar28,(int)lVar26);
            }
            bVar30 = lVar28 < cVar11;
            lVar28 = lVar28 + 1;
          } while (bVar30);
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != 0x15);
      goto LAB_0028126c;
    }
    bVar6 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
    if (bVar6 == '\0') {
      if (((u._1052_1_ & 2) == 0) ||
         (bVar6 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar6 != '\0')) {
        iVar14 = (int)u.uy;
        if ((u.utrap == 0) || (u.utraptype != 1)) {
          view_from(iVar14,(int)u.ux,loc_cs_rows,left_most,right_most,0,
                    (_func_void_int_int_void_ptr *)0x0,(void *)0x0);
        }
        else {
          uVar9 = iVar14 - 1;
          if (iVar14 + 1 < (int)uVar9) {
            bVar30 = false;
            goto LAB_00280c2f;
          }
          do {
            if (-1 < (int)uVar9) {
              if (0x14 < (int)uVar9) break;
              cVar16 = u.ux;
              uVar15 = 1;
              if ('\x01' < cVar16) {
                uVar15 = u._0_4_;
              }
              cVar21 = (char)uVar15 + -1;
              if ('M' < cVar16) {
                cVar16 = 'N';
              }
              left_most[uVar9] = cVar21;
              right_most[uVar9] = cVar16 + '\x01';
              if (cVar21 <= (char)(cVar16 + '\x01')) {
                pcVar20 = loc_cs_rows[uVar9];
                lVar26 = (ulong)(uVar15 & 0xff) - 2;
                do {
                  pcVar20[lVar26 + 1] = '\x03';
                  lVar26 = lVar26 + 1;
                } while (lVar26 < right_most[uVar9]);
              }
            }
            bVar30 = (int)uVar9 <= (int)u.uy;
            uVar9 = uVar9 + 1;
          } while (bVar30);
        }
        bVar30 = false;
      }
      else {
        uVar9 = (int)u.uy - 1;
        bVar30 = true;
        if ((int)uVar9 <= u.uy + 1) {
          do {
            iVar14 = (int)u.ux;
            if (iVar14 + -1 <= iVar14 + 1) {
              uVar7 = iVar14 - 2;
              uVar15 = iVar14 - 1;
              do {
                bVar30 = uVar7 < 0x4f;
                uVar7 = uVar7 + 1;
                cVar16 = (char)uVar15;
                if ((bVar30 && uVar9 < 0x15) && (bVar6 = is_pool(level,uVar7,uVar9), bVar6 != '\0'))
                {
                  cVar21 = left_most[uVar9];
                  if ((int)uVar7 <= (int)left_most[uVar9]) {
                    cVar21 = cVar16;
                  }
                  left_most[uVar9] = cVar21;
                  cVar21 = cVar16;
                  if ((int)uVar7 < (int)right_most[uVar9]) {
                    cVar21 = right_most[uVar9];
                  }
                  right_most[uVar9] = cVar21;
                  loc_cs_rows[uVar9][uVar7] = '\x03';
                }
                uVar15 = (uint)(byte)(cVar16 + 1);
              } while ((int)uVar7 <= (int)u.ux);
            }
            bVar3 = (int)uVar9 <= (int)u.uy;
            uVar9 = uVar9 + 1;
            bVar30 = true;
          } while (bVar3);
        }
      }
LAB_00280c2f:
      if (-1 < (long)u.xray_range) {
        if (u.xray_range == 0) {
          loc_cs_rows[u.uy][u.ux] = loc_cs_rows[u.uy][u.ux] | 2;
          xVar4 = u.ux;
          lVar26 = (long)u.uy;
          level->locations[u.ux][lVar26].seenv = 0xff;
          cVar16 = left_most[lVar26];
          if (xVar4 < left_most[lVar26]) {
            cVar16 = xVar4;
          }
          left_most[lVar26] = cVar16;
          cVar16 = right_most[lVar26];
          if (right_most[lVar26] < xVar4) {
            cVar16 = xVar4;
          }
          right_most[lVar26] = cVar16;
        }
        else {
          iVar14 = (int)u.uy;
          if (iVar14 - u.xray_range <= u.xray_range + iVar14) {
            cVar16 = ""[u.xray_range];
            uVar9 = iVar14 - u.xray_range;
            do {
              uVar25 = (ulong)uVar9;
              if (-1 < (int)uVar9) {
                if (0x14 < (int)uVar9) break;
                uVar7 = iVar14 - uVar9;
                uVar15 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar15 = uVar7;
                }
                uVar7 = (int)u.ux -
                        (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                             [(ulong)uVar15 + (long)cVar16];
                if ((int)uVar7 < 1) {
                  uVar7 = 0;
                }
                iVar14 = (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                              [(ulong)uVar15 + (long)cVar16] + (int)u.ux;
                if (0x4e < iVar14) {
                  iVar14 = 0x4f;
                }
                if ((int)uVar7 <= iVar14) {
                  pcVar20 = loc_cs_rows[uVar25];
                  lVar26 = (ulong)uVar7 * 0xfc + uVar25 * 0xc + 0x45;
                  uVar10 = (ulong)uVar7;
                  do {
                    bVar1 = pcVar20[uVar10];
                    pcVar20[uVar10] = bVar1 | 2;
                    cVar21 = level->levname[lVar26];
                    level->levname[lVar26] = -1;
                    if (((bVar1 & 2) == 0) || (cVar21 != -1)) {
                      newsym((int)uVar10,uVar9);
                    }
                    lVar26 = lVar26 + 0xfc;
                    bVar3 = (long)uVar10 < (long)iVar14;
                    uVar10 = uVar10 + 1;
                  } while (bVar3);
                }
                cVar21 = left_most[uVar25];
                if ((int)uVar7 < (int)cVar21) {
                  cVar21 = (char)uVar7;
                }
                left_most[uVar25] = cVar21;
                cVar21 = right_most[uVar25];
                if (cVar21 < iVar14) {
                  cVar21 = (char)iVar14;
                }
                right_most[uVar25] = cVar21;
              }
              iVar14 = (int)u.uy;
              bVar3 = (int)uVar9 < u.xray_range + iVar14;
              uVar9 = uVar9 + 1;
            } while (bVar3);
          }
        }
      }
      if ((!bVar30) && (u.xray_range < u.nv_range)) {
        if ((ulong)(uint)u.nv_range == 0) {
          loc_cs_rows[u.uy][u.ux] = loc_cs_rows[u.uy][u.ux] | 2;
          xVar4 = u.ux;
          lVar26 = (long)u.uy;
          level->locations[u.ux][lVar26].seenv = 0xff;
          cVar16 = left_most[lVar26];
          if (xVar4 < left_most[lVar26]) {
            cVar16 = xVar4;
          }
          left_most[lVar26] = cVar16;
          cVar16 = right_most[lVar26];
          if (right_most[lVar26] < xVar4) {
            cVar16 = xVar4;
          }
          right_most[lVar26] = cVar16;
        }
        else if (0 < u.nv_range) {
          iVar14 = (int)u.uy;
          if (iVar14 - u.nv_range <= u.nv_range + iVar14) {
            cVar16 = ""[(uint)u.nv_range];
            uVar9 = iVar14 - u.nv_range;
            do {
              if (-1 < (int)uVar9) {
                if (0x14 < (int)uVar9) break;
                uVar7 = iVar14 - uVar9;
                uVar15 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar15 = uVar7;
                }
                uVar7 = (int)u.ux -
                        (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                             [(ulong)uVar15 + (long)cVar16];
                if ((int)uVar7 < 1) {
                  uVar7 = 0;
                }
                iVar14 = (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                              [(ulong)uVar15 + (long)cVar16] + (int)u.ux;
                if (0x4e < iVar14) {
                  iVar14 = 0x4f;
                }
                if ((int)uVar7 <= iVar14) {
                  pcVar20 = loc_cs_rows[uVar9];
                  lVar26 = (ulong)uVar7 - 1;
                  do {
                    bVar1 = pcVar20[lVar26 + 1];
                    if (bVar1 != 0) {
                      pcVar20[lVar26 + 1] = bVar1 | 2;
                    }
                    lVar26 = lVar26 + 1;
                  } while (lVar26 < iVar14);
                }
                cVar21 = left_most[uVar9];
                if ((int)uVar7 < (int)cVar21) {
                  cVar21 = (char)uVar7;
                }
                left_most[uVar9] = cVar21;
                cVar21 = right_most[uVar9];
                if (cVar21 < iVar14) {
                  cVar21 = (char)iVar14;
                }
                right_most[uVar9] = cVar21;
              }
              iVar14 = (int)u.uy;
              bVar30 = (int)uVar9 < u.nv_range + iVar14;
              uVar9 = uVar9 + 1;
            } while (bVar30);
          }
        }
      }
    }
    else {
      uVar9 = *(ushort *)&level->locations[u.ux][u.uy].field_0x8 & 0x3f;
      if (2 < uVar9) {
        uVar25 = (ulong)(uVar9 - 3);
        iVar14 = (int)level->rooms[uVar25].ly;
        if (iVar14 + -1 <= level->rooms[uVar25].hy + 1) {
          pcVar20 = level->levname + uVar25 * 0xd8;
          lVar26 = (long)iVar14 * 0xc + -0xc3;
          lVar28 = (long)iVar14 + -1;
          do {
            iVar17 = (int)((mkroom *)(pcVar20 + 0xb960))->lx;
            left_most[lVar28] = (char)(iVar17 + -1);
            iVar22 = (int)level->rooms[uVar25].hx;
            iVar14 = iVar22 + 1;
            right_most[lVar28] = (char)iVar14;
            if (iVar17 + -1 <= iVar14) {
              lVar19 = (long)iVar17 + -2;
              lVar23 = (long)iVar17 * 0xfc + lVar26;
              do {
                if (level->rooms[uVar25].rlit == '\0') {
                  loc_cs_rows[lVar28][lVar19 + 1] = '\x01';
                }
                else {
                  loc_cs_rows[lVar28][lVar19 + 1] = '\x03';
                  level->levname[lVar23] = -1;
                }
                lVar19 = lVar19 + 1;
                lVar23 = lVar23 + 0xfc;
              } while (lVar19 <= iVar22);
            }
            pcVar20 = level->levname + uVar25 * 0xd8;
            lVar26 = lVar26 + 0xc;
            bVar30 = lVar28 <= pcVar20[0xb963];
            lVar28 = lVar28 + 1;
          } while (bVar30);
        }
      }
      uVar15 = (uint)u.uy;
      uVar9 = 1;
      if (1 < (int)uVar15) {
        uVar9 = uVar15;
      }
      uVar18 = (uint)u.ux;
      uVar7 = 0x13;
      if ((int)uVar15 < 0x13) {
        uVar7 = uVar15;
      }
      uVar25 = 2;
      if (2 < (int)uVar18) {
        uVar25 = (ulong)uVar18;
      }
      uVar24 = 0x4e;
      if ((int)uVar18 < 0x4e) {
        uVar24 = uVar18;
      }
      if ((int)(uVar9 - 1) <= (int)(uVar7 + 1)) {
        cVar16 = level->locations[(int)uVar18][(int)uVar15].typ;
        iVar14 = (int)uVar25 + -1;
        uVar10 = (ulong)uVar9 - 1;
        do {
          if ((int)uVar25 <= (int)left_most[uVar10]) {
            left_most[uVar10] = (char)iVar14;
          }
          if ((int)right_most[uVar10] <= (int)uVar24) {
            right_most[uVar10] = (char)(uVar24 + 1);
          }
          uVar27 = uVar25 - 1;
          if (iVar14 <= (int)(uVar24 + 1)) {
            do {
              loc_cs_rows[uVar10][uVar27] = '\x03';
              if ((cVar16 == '\x17') && ((uVar27 == (uint)(int)u.ux || (uVar10 == (uint)(int)u.uy)))
                 ) {
                newsym((int)uVar27,(int)uVar10);
              }
              bVar30 = (long)uVar27 <= (long)(int)uVar24;
              uVar27 = uVar27 + 1;
            } while (bVar30);
          }
          bVar30 = (long)uVar10 <= (long)(int)uVar7;
          uVar10 = uVar10 + 1;
        } while (bVar30);
      }
    }
  }
  do_light_sources(loc_cs_rows);
  ppcVar5 = viz_array;
  lVar26 = (long)u.ux;
  viz_array = loc_cs_rows;
  (vision_recalc::colbump + lVar26)[0] = '\x01';
  (vision_recalc::colbump + lVar26)[1] = '\x01';
  local_40 = 0x46;
  local_48 = 0;
  uVar25 = 0;
  do {
    cVar16 = left_most[uVar25];
    if (viz_rmin[uVar25] < left_most[uVar25]) {
      cVar16 = viz_rmin[uVar25];
    }
    cVar21 = right_most[uVar25];
    if (right_most[uVar25] < viz_rmax[uVar25]) {
      cVar21 = viz_rmax[uVar25];
    }
    if (cVar16 <= cVar21) {
      pcVar20 = loc_cs_rows[uVar25];
      lVar26 = 0;
      if (u.ux <= cVar16) {
        lVar26 = (ulong)(u.ux < cVar16) + 1;
      }
      uVar9 = (uint)(uVar25 != (uint)(int)u.uy);
      if ((long)u.uy < (long)uVar25) {
        uVar9 = 0xffffffff;
      }
      pcVar2 = ppcVar5[uVar25];
      puVar12 = seenv_matrix[uVar9 + 1] + lVar26;
      iVar14 = uVar9 + (int)uVar25;
      lVar28 = (long)cVar16 * 0xfc;
      pcVar29 = level->levname + local_40;
      lVar26 = (long)cVar16;
      do {
        bVar1 = pcVar20[lVar26];
        if ((bVar1 & 2) == 0) {
          if (((bVar1 & 1) != 0) && ((bVar1 & 4) != 0 || (*(uint *)(pcVar29 + lVar28) & 0x400) != 0)
             ) {
            cVar16 = pcVar29[lVar28 + -2];
            if ((cVar16 != '\0') &&
               ((((cVar16 == '\x0f' || (cVar16 == '\x17')) || (cVar16 < '\r')) &&
                (viz_clear[0][local_48 + lVar26] == '\0')))) {
              uVar10 = (ulong)(lVar26 != u.ux);
              if (u.ux < lVar26) {
                uVar10 = 0xffffffffffffffff;
              }
              if (((level->locations[uVar10 + lVar26][iVar14].field_0x7 & 4) == 0) &&
                 ((loc_cs_rows[iVar14][lVar26 + uVar10] & 4U) == 0)) goto LAB_002811e4;
            }
            pcVar20[lVar26] = bVar1 | 2;
            goto LAB_002811b5;
          }
          if (((bVar1 & 1) != 0) && ((*(uint *)(pcVar29 + lVar28) >> 0xb & 1) != 0)) {
            *(uint *)(pcVar29 + lVar28) = *(uint *)(pcVar29 + lVar28) & 0xfffff7ff;
            goto LAB_00281209;
          }
LAB_002811e4:
          bVar8 = pcVar2[lVar26];
          if (((bVar8 & 2) != 0) || ((bVar8 & 1) != (bVar1 & 1))) goto LAB_00281209;
        }
        else {
LAB_002811b5:
          bVar1 = pcVar29[lVar28 + -1];
          bVar8 = *puVar12 | bVar1;
          pcVar29[lVar28 + -1] = bVar8;
          if (((pcVar2[lVar26] & 2U) == 0) || (bVar1 != bVar8)) {
LAB_00281209:
            newsym((int)lVar26,(int)uVar25);
          }
        }
        puVar12 = puVar12 + vision_recalc::colbump[lVar26 + 1];
        pcVar29 = pcVar29 + 0xfc;
        bVar30 = lVar26 < cVar21;
        lVar26 = lVar26 + 1;
      } while (bVar30);
    }
    uVar25 = uVar25 + 1;
    local_48 = local_48 + 0x50;
    local_40 = local_40 + 0xc;
  } while (uVar25 != 0x15);
  lVar26 = (long)u.ux;
  (vision_recalc::colbump + lVar26)[0] = '\0';
  (vision_recalc::colbump + lVar26)[1] = '\0';
LAB_0028126c:
  if (program_state.panicking == 0) {
    newsym((int)u.ux,(int)u.uy);
  }
  viz_rmin = left_most;
  viz_rmax = right_most;
  return;
}

Assistant:

void vision_recalc(int control)
{
    char **temp_array;	/* points to the old vision array */
    char **next_array;	/* points to the new vision array */
    char *next_row;	/* row pointer for the new array */
    char *old_row;	/* row pointer for the old array */
    char *next_rmin;	/* min pointer for the new array */
    char *next_rmax;	/* max pointer for the new array */
    const char *ranges;	/* circle ranges -- used for xray & night vision */
    int row;		/* row counter (outer loop)  */
    int start, stop;	/* inner loop starting/stopping index */
    int dx, dy;		/* one step from a lit door or lit wall (see below) */
    int col;	/* inner loop counter */
    struct rm *loc;	/* pointer to current pos */
    struct rm *flev;	/* pointer to position in "front" of current pos */
    extern unsigned char seenv_matrix[3][3];	/* from display.c */
    static unsigned char colbump[COLNO+1];	/* cols to bump sv */
    unsigned char *sv;				/* ptr to seen angle bits */
    int oldseenv;				/* previous seenv value */

    vision_full_recalc = 0;			/* reset flag */
    if (in_mklev || !iflags.vision_inited) return;

    /*
     * Either the light sources have been taken care of, or we must
     * recalculate them here.
     */

    /* Get the unused could see, row min, and row max arrays. */
    get_unused_cs(&next_array, &next_rmin, &next_rmax);

    /* You see nothing, nothing can see you --- if swallowed or refreshing. */
    if (u.uswallow || control == 2) {
	/* do nothing -- get_unused_cs() nulls out the new work area */

    } else if (Blind) {
	/*
	 * Calculate the could_see array even when blind so that monsters
	 * can see you, even if you can't see them.  Note that the current
	 * setup allows:
	 *
	 *	+ Monsters to see with the "new" vision, even on the rogue
	 *	  level.
	 *
	 *	+ Monsters can see you even when you're in a pit.
	 */
	view_from(u.uy, u.ux, next_array, next_rmin, next_rmax,
		0, (void (*)(int,int,void *))0, 0);

	/*
	 * Our own version of the update loop below.  We know we can't see
	 * anything, so we only need update positions we used to be able
	 * to see.
	 */
	temp_array = viz_array;	/* set viz_array so newsym() will work */
	viz_array = next_array;

	for (row = 0; row < ROWNO; row++) {
	    old_row = temp_array[row];

	    /* Find the min and max positions on the row. */
	    start = min(viz_rmin[row], next_rmin[row]);
	    stop  = max(viz_rmax[row], next_rmax[row]);

	    for (col = start; col <= stop; col++)
		if (old_row[col] & IN_SIGHT) newsym(col,row);
	}

	/* skip the normal update loop */
	goto skip;
    }
    else if (Is_rogue_level(&u.uz)) {
	rogue_vision(next_array,next_rmin,next_rmax);
    }
    else {
	int has_night_vision = 1;	/* hero has night vision */

	if (Underwater && !Is_waterlevel(&u.uz)) {
	    /*
	     * The hero is under water.  Only see surrounding locations if
	     * they are also underwater.  This overrides night vision but
	     * does not override x-ray vision.
	     */
	    has_night_vision = 0;

	    for (row = u.uy-1; row <= u.uy+1; row++)
		for (col = u.ux-1; col <= u.ux+1; col++) {
		    if (!isok(col,row) || !is_pool(level, col,row)) continue;

		    next_rmin[row] = min(next_rmin[row], col);
		    next_rmax[row] = max(next_rmax[row], col);
		    next_array[row][col] = IN_SIGHT | COULD_SEE;
		}
	}

	/* if in a pit, just update for immediate locations */
	else if (u.utrap && u.utraptype == TT_PIT) {
	    for (row = u.uy-1; row <= u.uy+1; row++) {
		if (row < 0) continue;	if (row >= ROWNO) break;

		next_rmin[row] = max(      0, u.ux - 1);
		next_rmax[row] = min(COLNO-1, u.ux + 1);
		next_row = next_array[row];

		for (col=next_rmin[row]; col <= next_rmax[row]; col++)
		    next_row[col] = IN_SIGHT | COULD_SEE;
	    }
	} else
	    view_from(u.uy, u.ux, next_array, next_rmin, next_rmax,
		0, (void (*)(int,int,void *))0, 0);

	/*
	 * Set the IN_SIGHT bit for xray and night vision.
	 */
	if (u.xray_range >= 0) {
	    if (u.xray_range) {
		ranges = circle_ptr(u.xray_range);

		for (row = u.uy-u.xray_range; row <= u.uy+u.xray_range; row++) {
		    if (row < 0) continue;	if (row >= ROWNO) break;
		    dy = v_abs(u.uy-row);	next_row = next_array[row];

		    start = max(      0, u.ux - ranges[dy]);
		    stop  = min(COLNO-1, u.ux + ranges[dy]);

		    for (col = start; col <= stop; col++) {
			char old_row_val = next_row[col];
			next_row[col] |= IN_SIGHT;
			oldseenv = level->locations[col][row].seenv;
			level->locations[col][row].seenv = SVALL;	/* see all! */
			/* Update if previously not in sight or new angle. */
			if (!(old_row_val & IN_SIGHT) || oldseenv != SVALL)
			    newsym(col,row);
		    }

		    next_rmin[row] = min(start, next_rmin[row]);
		    next_rmax[row] = max(stop, next_rmax[row]);
		}

	    } else {	/* range is 0 */
		next_array[u.uy][u.ux] |= IN_SIGHT;
		level->locations[u.ux][u.uy].seenv = SVALL;
		next_rmin[u.uy] = min(u.ux, next_rmin[u.uy]);
		next_rmax[u.uy] = max(u.ux, next_rmax[u.uy]);
	    }
	}

	if (has_night_vision && u.xray_range < u.nv_range) {
	    if (!u.nv_range) {	/* range is 0 */
		next_array[u.uy][u.ux] |= IN_SIGHT;
		level->locations[u.ux][u.uy].seenv = SVALL;
		next_rmin[u.uy] = min(u.ux, next_rmin[u.uy]);
		next_rmax[u.uy] = max(u.ux, next_rmax[u.uy]);
	    } else if (u.nv_range > 0) {
		ranges = circle_ptr(u.nv_range);

		for (row = u.uy-u.nv_range; row <= u.uy+u.nv_range; row++) {
		    if (row < 0) continue;	if (row >= ROWNO) break;
		    dy = v_abs(u.uy-row);	next_row = next_array[row];

		    start = max(      0, u.ux - ranges[dy]);
		    stop  = min(COLNO-1, u.ux + ranges[dy]);

		    for (col = start; col <= stop; col++)
			if (next_row[col]) next_row[col] |= IN_SIGHT;

		    next_rmin[row] = min(start, next_rmin[row]);
		    next_rmax[row] = max(stop, next_rmax[row]);
		}
	    }
	}
    }

    /* Set the correct bits for all light sources. */
    do_light_sources(next_array);


    /*
     * Make the viz_array the new array so that cansee() will work correctly.
     */
    temp_array = viz_array;
    viz_array = next_array;

    /*
     * The main update loop.  Here we do two things:
     *
     *	    + Set the IN_SIGHT bit for places that we could see and are lit.
     *	    + Reset changed places.
     *
     * There is one thing that make deciding what the hero can see
     * difficult:
     *
     *  1.  Directional lighting.  Items that block light create problems.
     *      The worst offenders are doors.  Suppose a door to a lit room
     *      is closed.  It is lit on one side, but not on the other.  How
     *      do you know?  You have to check the closest adjacent position.
     *	    Even so, that is not entirely correct.  But it seems close
     *	    enough for now.
     */
    colbump[u.ux] = colbump[u.ux+1] = 1;
    for (row = 0; row < ROWNO; row++) {
	dy = u.uy - row;                dy = sign(dy);
	next_row = next_array[row];     old_row = temp_array[row];

	/* Find the min and max positions on the row. */
	start = min(viz_rmin[row], next_rmin[row]);
	stop  = max(viz_rmax[row], next_rmax[row]);
	loc = &level->locations[start][row];

	sv = &seenv_matrix[dy+1][start < u.ux ? 0 : (start > u.ux ? 2:1)];

	for (col = start; col <= stop;
				loc += ROWNO, sv += (int) colbump[++col]) {
	    if (next_row[col] & IN_SIGHT) {
		/*
		 * We see this position because of night- or xray-vision.
		 */
		oldseenv = loc->seenv;
		loc->seenv |= new_angle(loc,sv,row,col); /* update seen angle */

		/* Update pos if previously not in sight or new angle. */
		if ( !(old_row[col] & IN_SIGHT) || oldseenv != loc->seenv)
		    newsym(col,row);
	    }

	    else if ((next_row[col] & COULD_SEE)
				&& (loc->lit || (next_row[col] & TEMP_LIT))) {
		/*
		 * We see this position because it is lit.
		 */
		if ((IS_DOOR(loc->typ) || loc->typ == SDOOR ||
		     IS_WALL(loc->typ)) && !viz_clear[row][col]) {
		    /*
		     * Make sure doors, walls, boulders or mimics don't show up
		     * at the end of dark hallways.  We do this by checking
		     * the adjacent position.  If it is lit, then we can see
		     * the door or wall, otherwise we can't.
		     */
		    dx = u.ux - col;	dx = sign(dx);
		    flev = &(level->locations[col+dx][row+dy]);
		    if (flev->lit || next_array[row+dy][col+dx] & TEMP_LIT) {
			next_row[col] |= IN_SIGHT;	/* we see it */

			oldseenv = loc->seenv;
			loc->seenv |= new_angle(loc,sv,row,col);

			/* Update pos if previously not in sight or new angle.*/
			if (!(old_row[col] & IN_SIGHT) || oldseenv!=loc->seenv)
			    newsym(col,row);
		    } else
			goto not_in_sight;	/* we don't see it */

		} else {
		    next_row[col] |= IN_SIGHT;	/* we see it */

		    oldseenv = loc->seenv;
		    loc->seenv |= new_angle(loc,sv,row,col);

		    /* Update pos if previously not in sight or new angle. */
		    if ( !(old_row[col] & IN_SIGHT) || oldseenv != loc->seenv)
			newsym(col,row);
		}
	    } else if ((next_row[col] & COULD_SEE) && loc->waslit) {
		/*
		 * If we make it here, the hero _could see_ the location,
		 * but doesn't see it (location is not lit).
		 * However, the hero _remembers_ it as lit (waslit is true).
		 * The hero can now see that it is not lit, so change waslit
		 * and update the location.
		 */
		loc->waslit = 0; /* remember lit condition */
		newsym(col,row);
	    }
	    /*
	     * At this point we know that the row position is *not* in normal
	     * sight.  That is, the position is could be seen, but is dark
	     * or LOS is just plain blocked.
	     *
	     * Update the position if:
	     * o If the old one *was* in sight.  We may need to clean up
	     *   the glyph -- E.g. darken room spot, etc.
	     * o If we now could see the location (yet the location is not
	     *   lit), but previously we couldn't see the location, or vice
	     *   versa.  Update the spot because there there may be an infared
	     *   monster there.
	     */
	    else {
not_in_sight:
		if ((old_row[col] & IN_SIGHT)
			|| ((next_row[col] & COULD_SEE)
				^ (old_row[col] & COULD_SEE)))
		    newsym(col,row);
	    }

	} /* end for col . . */
    }	/* end for row . .  */
    colbump[u.ux] = colbump[u.ux+1] = 0;

skip:
    /* This newsym() caused a crash delivering msg about failure to open
     * dungeon file init_dungeons() -> panic() -> done(11) ->
     * vision_recalc(2) -> newsym() -> crash!  u.ux and u.uy are 0 and
     * program_state.panicking == 1 under those circumstances
     */
    if (!program_state.panicking)
	newsym(u.ux, u.uy);		/* Make sure the hero shows up! */

    /* Set the new min and max pointers. */
    viz_rmin  = next_rmin;
    viz_rmax = next_rmax;
}